

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,CappedArray<char,_14UL> *params_9,
          ArrayPtr<const_char> *params_10,StringTree *params_11,ArrayPtr<const_char> *params_12,
          ArrayPtr<const_char> *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,ArrayPtr<const_char> *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          CappedArray<char,_14UL> *params_19,ArrayPtr<const_char> *params_20,StringTree *params_21,
          ArrayPtr<const_char> *params_22,ArrayPtr<const_char> *params_23,
          ArrayPtr<const_char> *params_24,ArrayPtr<const_char> *params_25,
          ArrayPtr<const_char> *params_26,ArrayPtr<const_char> *params_27,
          ArrayPtr<const_char> *params_28,CappedArray<char,_14UL> *params_29,
          ArrayPtr<const_char> *params_30,StringTree *params_31,ArrayPtr<const_char> *params_32,
          ArrayPtr<const_char> *params_33,ArrayPtr<const_char> *params_34,
          ArrayPtr<const_char> *params_35,ArrayPtr<const_char> *params_36,
          ArrayPtr<const_char> *params_37,ArrayPtr<const_char> *params_38,
          CappedArray<char,_14UL> *params_39,ArrayPtr<const_char> *params_40,StringTree *params_41,
          ArrayPtr<const_char> *params_42,ArrayPtr<const_char> *params_43,
          ArrayPtr<const_char> *params_44,ArrayPtr<const_char> *params_45,
          ArrayPtr<const_char> *params_46,ArrayPtr<const_char> *params_47,
          ArrayPtr<const_char> *params_48,CappedArray<char,_14UL> *params_49,
          ArrayPtr<const_char> *params_50)

{
  ArrayPtr<const_char> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_208;
  StringTree *local_1f0;
  StringTree *local_1e8;
  StringTree *local_1e0;
  ArrayPtr<const_char> *local_1d8;
  ArrayPtr<const_char> *local_1d0;
  size_t local_1c8;
  size_t sStack_1c0;
  char *local_1b8;
  size_t sStack_1b0;
  size_t local_1a8;
  size_t sStack_1a0;
  size_t local_198;
  size_t sStack_190;
  size_t local_188;
  char *pcStack_180;
  undefined8 local_178;
  char *local_170;
  char *local_168;
  size_t sStack_160;
  size_t local_158;
  size_t sStack_150;
  size_t local_148;
  size_t sStack_140;
  size_t local_138;
  char *pcStack_130;
  undefined8 local_128;
  char *local_120;
  char *local_118;
  size_t sStack_110;
  size_t local_108;
  size_t sStack_100;
  size_t local_f8;
  size_t sStack_f0;
  size_t local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *local_d0;
  char *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *local_80;
  char *local_78;
  size_t sStack_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_1c8 = this->size_;
  sStack_1c0 = params->size_;
  local_1b8 = (params_1->text).content.ptr;
  sStack_1b0 = params_2->size_;
  local_1a8 = params_3->size_;
  sStack_1a0 = params_4->size_;
  local_198 = params_5->size_;
  sStack_190 = params_6->size_;
  local_188 = params_7->size_;
  pcStack_180 = params_8->ptr;
  local_178 = *(undefined8 *)params_9->content;
  local_170 = params_10->ptr;
  local_168 = (params_11->text).content.ptr;
  sStack_160 = params_12->size_;
  local_158 = params_13->size_;
  sStack_150 = params_14->size_;
  local_148 = params_15->size_;
  sStack_140 = params_16->size_;
  local_138 = params_17->size_;
  pcStack_130 = params_18->ptr;
  local_128 = *(undefined8 *)params_19->content;
  local_120 = params_20->ptr;
  local_118 = (params_21->text).content.ptr;
  sStack_110 = params_22->size_;
  local_108 = params_23->size_;
  sStack_100 = params_24->size_;
  local_f8 = params_25->size_;
  sStack_f0 = params_26->size_;
  local_e8 = params_27->size_;
  pcStack_e0 = params_28->ptr;
  local_d8 = *(undefined8 *)params_29->content;
  local_d0 = params_30->ptr;
  local_c8 = (params_31->text).content.ptr;
  sStack_c0 = params_32->size_;
  local_b8 = params_33->size_;
  sStack_b0 = params_34->size_;
  local_a8 = params_35->size_;
  sStack_a0 = params_36->size_;
  local_98 = params_37->size_;
  pcStack_90 = params_38->ptr;
  local_88 = *(undefined8 *)params_39->content;
  local_80 = params_40->ptr;
  local_78 = (params_41->text).content.ptr;
  sStack_70 = params_42->size_;
  local_68 = params_43->size_;
  sStack_60 = params_44->size_;
  local_58 = params_45->size_;
  sStack_50 = params_46->size_;
  local_48 = params_47->size_;
  pcStack_40 = params_48->ptr;
  local_38 = *(undefined8 *)params_49->content;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x33;
  local_1f0 = this;
  local_1e8 = params;
  local_1d0 = params_3;
  sVar1 = _::sum((_ *)&local_1c8,nums);
  rest_3 = local_1d0;
  __return_storage_ptr__->size_ = sVar1;
  local_1c8 = 0;
  sStack_1c0 = 0;
  local_1b8 = (params_1->text).content.ptr;
  sStack_1b0 = params_2->size_;
  local_1a8 = local_1d0->size_;
  sStack_1a0 = params_4->size_;
  local_198 = params_5->size_;
  sStack_190 = params_6->size_;
  local_188 = params_7->size_;
  pcStack_180 = params_8->ptr;
  local_178 = *(undefined8 *)params_9->content;
  local_170 = (char *)0x0;
  local_168 = (params_11->text).content.ptr;
  sStack_160 = params_12->size_;
  local_158 = params_13->size_;
  sStack_150 = params_14->size_;
  local_148 = params_15->size_;
  sStack_140 = params_16->size_;
  local_138 = params_17->size_;
  pcStack_130 = params_18->ptr;
  local_128 = *(undefined8 *)params_19->content;
  local_120 = (char *)0x0;
  local_118 = (params_21->text).content.ptr;
  sStack_110 = params_22->size_;
  local_108 = params_23->size_;
  sStack_100 = params_24->size_;
  local_f8 = params_25->size_;
  sStack_f0 = params_26->size_;
  local_e8 = params_27->size_;
  pcStack_e0 = params_28->ptr;
  local_d8 = *(undefined8 *)params_29->content;
  local_d0 = (char *)0x0;
  local_c8 = (params_31->text).content.ptr;
  sStack_c0 = params_32->size_;
  local_b8 = params_33->size_;
  sStack_b0 = params_34->size_;
  local_a8 = params_35->size_;
  sStack_a0 = params_36->size_;
  local_98 = params_37->size_;
  pcStack_90 = params_38->ptr;
  local_88 = *(undefined8 *)params_39->content;
  local_80 = (char *)0x0;
  local_78 = (params_41->text).content.ptr;
  sStack_70 = params_42->size_;
  local_68 = params_43->size_;
  sStack_60 = params_44->size_;
  local_58 = params_45->size_;
  sStack_50 = params_46->size_;
  local_48 = params_47->size_;
  pcStack_40 = params_48->ptr;
  local_38 = *(undefined8 *)params_49->content;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x33;
  local_1e0 = params_1;
  local_1d8 = params_2;
  sVar1 = _::sum((_ *)&local_1c8,nums_00);
  heapString((String *)&local_208,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_208);
  Array<char>::~Array((Array<char> *)&local_208);
  local_1c8 = 1;
  sStack_1c0 = 1;
  local_1b8 = (char *)0x0;
  sStack_1b0 = 0;
  local_1a8 = 0;
  sStack_1a0 = 0;
  local_198 = 0;
  sStack_190 = 0;
  local_188 = 0;
  pcStack_180 = (char *)0x0;
  local_178 = 0;
  local_170 = (char *)0x1;
  local_168 = (char *)0x0;
  sStack_160 = 0;
  local_158 = 0;
  sStack_150 = 0;
  local_148 = 0;
  sStack_140 = 0;
  local_138 = 0;
  pcStack_130 = (char *)0x0;
  local_128 = 0;
  local_120 = (char *)0x1;
  local_118 = (char *)0x0;
  sStack_110 = 0;
  local_108 = 0;
  sStack_100 = 0;
  local_f8 = 0;
  sStack_f0 = 0;
  local_e8 = 0;
  pcStack_e0 = (char *)0x0;
  local_d8 = 0;
  local_d0 = (char *)0x1;
  local_98 = 0;
  pcStack_90 = (char *)0x0;
  local_a8 = 0;
  sStack_a0 = 0;
  local_b8 = 0;
  sStack_b0 = 0;
  local_c8 = (char *)0x0;
  sStack_c0 = 0;
  local_88 = 0;
  local_80 = (char *)0x1;
  local_48 = 0;
  pcStack_40 = (char *)0x0;
  local_58 = 0;
  sStack_50 = 0;
  local_68 = 0;
  sStack_60 = 0;
  local_78 = (char *)0x0;
  sStack_70 = 0;
  local_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x33;
  sVar1 = _::sum((_ *)&local_1c8,nums_01);
  local_208.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_208.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_208.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_208);
  Array<kj::StringTree::Branch>::~Array(&local_208);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_1f0,local_1e8,(ArrayPtr<const_char> *)local_1e0,
             local_1d8,rest_3,params_4,params_5,params_6,params_7,
             (CappedArray<char,_14UL> *)params_8,(ArrayPtr<const_char> *)params_9,
             (StringTree *)params_10,(ArrayPtr<const_char> *)params_11,params_12,params_13,params_14
             ,params_15,params_16,params_17,(CappedArray<char,_14UL> *)params_18,
             (ArrayPtr<const_char> *)params_19,(StringTree *)params_20,
             (ArrayPtr<const_char> *)params_21,params_22,params_23,params_24,params_25,params_26,
             params_27,(CappedArray<char,_14UL> *)params_28,(ArrayPtr<const_char> *)params_29,
             (StringTree *)params_30,(ArrayPtr<const_char> *)params_31,params_32,params_33,params_34
             ,params_35,params_36,params_37,(CappedArray<char,_14UL> *)params_38,
             (ArrayPtr<const_char> *)params_39,(StringTree *)params_40,
             (ArrayPtr<const_char> *)params_41,params_42,params_43,params_44,params_45,params_46,
             params_47,(CappedArray<char,_14UL> *)params_48,(ArrayPtr<const_char> *)params_49);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}